

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void sgai_scale_col_values(Integer type,Integer *lo,Integer *hi,Integer ld,void *ptr,Integer g_v)

{
  long lVar1;
  Integer IVar2;
  void *__ptr;
  double *pdVar3;
  long lVar4;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  Integer in_RDI;
  long in_R8;
  Integer j;
  Integer i;
  Integer mycols;
  SingleComplex *fca;
  DoubleComplex *dca;
  long *la;
  double *da;
  float *fa;
  int *ia;
  void *buf;
  Integer size;
  Integer vhi;
  Integer vlo;
  Integer in_stack_000000f8;
  char *in_stack_00000100;
  Integer *in_stack_00000110;
  void *in_stack_00000118;
  Integer *in_stack_00000120;
  Integer *in_stack_00000128;
  Integer in_stack_00000130;
  long local_98;
  long local_90;
  
  if ((0 < in_RSI[1]) && (*in_RSI <= *in_RDX)) {
    lVar4 = in_RDX[1];
    lVar1 = in_RSI[1];
    IVar2 = GAsizeof(in_RDI);
    __ptr = malloc(((lVar4 - lVar1) + 1) * IVar2);
    if (__ptr == (void *)0x0) {
      pnga_error(in_stack_00000100,in_stack_000000f8);
    }
    pnga_get(in_stack_00000130,in_stack_00000128,in_stack_00000120,in_stack_00000118,
             in_stack_00000110);
    switch(in_RDI) {
    case 0x3e9:
      for (local_98 = 0; local_98 < (in_RDX[1] - in_RSI[1]) + 1; local_98 = local_98 + 1) {
        for (local_90 = 0; local_90 < (*in_RDX - *in_RSI) + 1; local_90 = local_90 + 1) {
          lVar4 = local_98 * in_RCX + local_90;
          *(int *)(in_R8 + lVar4 * 4) =
               *(int *)((long)__ptr + local_98 * 4) * *(int *)(in_R8 + lVar4 * 4);
        }
      }
      break;
    case 0x3ea:
      for (local_98 = 0; local_98 < (in_RDX[1] - in_RSI[1]) + 1; local_98 = local_98 + 1) {
        for (local_90 = 0; local_90 < (*in_RDX - *in_RSI) + 1; local_90 = local_90 + 1) {
          lVar4 = local_98 * in_RCX + local_90;
          *(long *)(in_R8 + lVar4 * 8) =
               *(long *)((long)__ptr + local_98 * 8) * *(long *)(in_R8 + lVar4 * 8);
        }
      }
      break;
    case 0x3eb:
      for (local_98 = 0; local_98 < (in_RDX[1] - in_RSI[1]) + 1; local_98 = local_98 + 1) {
        for (local_90 = 0; local_90 < (*in_RDX - *in_RSI) + 1; local_90 = local_90 + 1) {
          lVar4 = local_98 * in_RCX + local_90;
          *(float *)(in_R8 + lVar4 * 4) =
               *(float *)((long)__ptr + local_98 * 4) * *(float *)(in_R8 + lVar4 * 4);
        }
      }
      break;
    case 0x3ec:
      for (local_98 = 0; local_98 < (in_RDX[1] - in_RSI[1]) + 1; local_98 = local_98 + 1) {
        for (local_90 = 0; local_90 < (*in_RDX - *in_RSI) + 1; local_90 = local_90 + 1) {
          lVar4 = local_98 * in_RCX + local_90;
          *(double *)(in_R8 + lVar4 * 8) =
               *(double *)((long)__ptr + local_98 * 8) * *(double *)(in_R8 + lVar4 * 8);
        }
      }
      break;
    default:
      pnga_error(in_stack_00000100,in_stack_000000f8);
      break;
    case 0x3ee:
      for (local_98 = 0; local_98 < (in_RDX[1] - in_RSI[1]) + 1; local_98 = local_98 + 1) {
        for (local_90 = 0; local_90 < (*in_RDX - *in_RSI) + 1; local_90 = local_90 + 1) {
          lVar4 = local_98 * in_RCX + local_90;
          *(float *)(in_R8 + lVar4 * 8) =
               *(float *)((long)__ptr + local_98 * 8) * *(float *)(in_R8 + lVar4 * 8);
          lVar4 = local_98 * in_RCX + local_90;
          *(float *)(in_R8 + 4 + lVar4 * 8) =
               *(float *)((long)__ptr + local_98 * 8 + 4) * *(float *)(in_R8 + 4 + lVar4 * 8);
        }
      }
      break;
    case 0x3ef:
      for (local_98 = 0; local_98 < (in_RDX[1] - in_RSI[1]) + 1; local_98 = local_98 + 1) {
        for (local_90 = 0; local_90 < (*in_RDX - *in_RSI) + 1; local_90 = local_90 + 1) {
          pdVar3 = (double *)(in_R8 + (local_98 * in_RCX + local_90) * 0x10);
          *pdVar3 = *(double *)((long)__ptr + local_98 * 0x10) * *pdVar3;
          lVar4 = in_R8 + (local_98 * in_RCX + local_90) * 0x10;
          *(double *)(lVar4 + 8) =
               *(double *)((long)__ptr + local_98 * 0x10 + 8) * *(double *)(lVar4 + 8);
        }
      }
    }
    free(__ptr);
  }
  return;
}

Assistant:

static void sgai_scale_col_values(Integer type, Integer *lo,
                          Integer *hi, Integer ld, void *ptr, Integer g_v)
{
  Integer vlo, vhi, size;
  void *buf;
  int *ia;
  float *fa;
  double *da;
  long *la;
  DoubleComplex *dca;
  SingleComplex *fca;

  /* determine subset of my patch to access */
  if (lo[1] > 0) {
    if (hi[0] >= lo[0]) {     /*make sure the equality symbol is there!!! */
                              /* we got a block containing diagonal elements*/

      Integer mycols = hi[1] - lo[1] + 1;
      Integer i, j;
      /*number of rows on the patch is jhiA - jloA + 1 */
      vlo =lo[1] ;
      vhi = hi[1];

      /*allocate a buffer for the given vector g_v */
      size = GAsizeof (type);

      buf = malloc (mycols * size);
      if (buf == NULL)
        pnga_error
          ("ga_scale_cols_:failed to allocate memory for the local buffer.",
           0);

      /* get the vector from the global array to the local memory buffer */
      pnga_get (g_v, &vlo, &vhi, buf, &vhi);

      switch (type) {
        case C_INT:
          ia = (int *) ptr;
          for(j=0;j<hi[1]-lo[1]+1;j++) /*for each column*/
            for (i = 0; i < hi[0]-lo[0]+1; i++) /*for each row */
              ia[j*ld+i] *= ((int *) buf)[j];
          break;
        case C_LONG:
          la = (long *) ptr;
          for(j=0;j<hi[1]-lo[1]+1;j++)
            for (i = 0; i < hi[0]-lo[0]+1; i++)
              la[j*ld+i] *= ((long *) buf)[j];
          break;
        case C_FLOAT:
          fa = (float *) ptr;
          for(j=0;j<hi[1]-lo[1]+1;j++)
            for (i = 0; i < hi[0]-lo[0]+1; i++)
              fa[j*ld+i] *= ((float *) buf)[j];
          break;
        case C_DBL:
          da = (double *) ptr;
          for(j=0;j<hi[1]-lo[1]+1;j++)
            for (i = 0; i < hi[0]-lo[0]+1; i++)
              da[j*ld+i] *= ((double *) buf)[j];
          break;
        case C_DCPL:
          dca = (DoubleComplex *) ptr;
          for(j=0;j<hi[1]-lo[1]+1;j++)
            for (i = 0; i < hi[0]-lo[0]+1; i++)
            {
              (dca[j*ld+i]).real *= (((DoubleComplex *) buf)[j]).real;
              (dca[j*ld+i]).imag *= (((DoubleComplex *) buf)[j]).imag;
            }
          break;
        case C_SCPL:
          fca = (SingleComplex *) ptr;
          for(j=0;j<hi[1]-lo[1]+1;j++)
            for (i = 0; i < hi[0]-lo[0]+1; i++)
            {
              (fca[j*ld+i]).real *= (((SingleComplex *) buf)[j]).real;
              (fca[j*ld+i]).imag *= (((SingleComplex *) buf)[j]).imag;
            }
          break;
        default:
          pnga_error("ga_scale_cols_: wrong data type:", type);
      }
      /*free the memory */
      free (buf);
    }
  }
}